

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O1

void __thiscall amrex::FluxRegister::ClearInternalBorders(FluxRegister *this,Geometry *geom)

{
  undefined8 *puVar1;
  NumComps ncomp;
  uint uVar2;
  undefined8 uVar3;
  FabSet *pFVar4;
  int *piVar5;
  int iVar6;
  BoxArray *pBVar7;
  FabArrayBase *pFVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Box result;
  Box result_1;
  FabSetIter fsi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_148;
  FabSet *local_130;
  Box local_128;
  long local_100;
  double local_f8;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_f0;
  Box local_d8;
  MFIter local_b0;
  Box local_4c;
  
  ncomp.n = this->ncomp;
  local_130 = (this->super_BndryRegister).bndry;
  lVar9 = 0;
  do {
    local_100 = lVar9 * 0x180;
    pFVar8 = (FabArrayBase *)(local_130 + lVar9);
    MFIter::MFIter(&local_b0,pFVar8,'\0');
    if (local_b0.currentIndex < local_b0.endIndex) {
      pBVar7 = (BoxArray *)
               ((long)&local_130[3].m_mf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       boxarray.m_bat.m_bat_type + local_100);
      do {
        BATransformer::operator()
                  (&local_4c,&((local_b0.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_b0.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_b0.currentIndex] * 0x1c +
                          *(long *)&((((local_b0.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        BoxArray::intersections(&local_148,pBVar7,&local_4c);
        if (0 < (int)((ulong)((long)local_148.
                                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_148.
                                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
          lVar10 = 4;
          lVar11 = 0;
          do {
            piVar5 = &local_b0.currentIndex;
            if (local_b0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar5 = ((local_b0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start + local_b0.currentIndex;
            }
            local_128.smallend.vect[0] = 0;
            local_128.smallend.vect[1] = 0;
            BaseFab<double>::setVal<(amrex::RunOn)1>
                      (*(BaseFab<double> **)
                        (*(long *)((long)&pFVar8[1].boxarray.m_bat.m_op + 0xc) + (long)*piVar5 * 8),
                       (double *)&local_128,
                       (Box *)((long)((local_148.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                                     vect + lVar10 + -4),(DestComp)0x0,ncomp);
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 0x20;
          } while (lVar11 < (int)((ulong)((long)local_148.
                                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_148.
                                               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 5));
        }
        if ((*(char *)((long)(geom->super_CoordSys).inv_dx + lVar9 + 0x19) != '\0') &&
           (iVar6 = (geom->domain).smallend.vect[lVar9], local_4c.smallend.vect[lVar9] == iVar6)) {
          iVar6 = ((geom->domain).bigend.vect[lVar9] - iVar6) + 1;
          local_128.bigend.vect[2] = local_4c.bigend.vect[2];
          local_128.btype.itype = local_4c.btype.itype;
          local_128.smallend.vect[0] = local_4c.smallend.vect[0];
          local_128.smallend.vect[1] = local_4c.smallend.vect[1];
          piVar5 = local_128.smallend.vect + lVar9;
          *piVar5 = *piVar5 + iVar6;
          piVar5 = local_128.bigend.vect + lVar9;
          *piVar5 = *piVar5 + iVar6;
          BoxArray::intersections(&local_f0,pBVar7,&local_128);
          if (0 < (int)((ulong)((long)local_f0.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_f0.
                                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
            lVar11 = 4;
            lVar10 = 0;
            do {
              iVar6 = ~(geom->domain).bigend.vect[lVar9] + (geom->domain).smallend.vect[lVar9];
              piVar5 = (int *)((long)((local_f0.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                                     vect + lVar11 + -4);
              uVar3 = *(undefined8 *)(piVar5 + 2);
              puVar1 = (undefined8 *)
                       ((long)((local_f0.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->second).smallend.vect +
                       lVar11 + 8);
              local_d8.bigend.vect[1] = (int)((ulong)*puVar1 >> 0x20);
              local_d8._20_8_ = puVar1[1];
              local_d8.smallend.vect._0_8_ = *(undefined8 *)piVar5;
              local_d8.smallend.vect[2] = (int)uVar3;
              local_d8.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
              piVar5 = local_d8.smallend.vect + lVar9;
              *piVar5 = *piVar5 + iVar6;
              piVar5 = local_d8.bigend.vect + lVar9;
              *piVar5 = *piVar5 + iVar6;
              piVar5 = &local_b0.currentIndex;
              if (local_b0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar5 = ((local_b0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + local_b0.currentIndex;
              }
              local_f8 = 0.0;
              BaseFab<double>::setVal<(amrex::RunOn)1>
                        (*(BaseFab<double> **)
                          (*(long *)((long)&pFVar8[1].boxarray.m_bat.m_op + 0xc) + (long)*piVar5 * 8
                          ),&local_f8,&local_d8,(DestComp)0x0,ncomp);
              lVar10 = lVar10 + 1;
              lVar11 = lVar11 + 0x20;
            } while (lVar10 < (int)((ulong)((long)local_f0.
                                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_f0.
                                                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 5));
          }
          if (local_f0.
              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f0.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_f0.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f0.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_148.
            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_148.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_148.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_148.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        MFIter::operator++(&local_b0);
      } while (local_b0.currentIndex < local_b0.endIndex);
    }
    lVar10 = local_100;
    pFVar4 = local_130;
    pFVar8 = (FabArrayBase *)
             ((long)&local_130[3].m_mf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                     _vptr_FabArrayBase + local_100);
    MFIter::~MFIter(&local_b0);
    MFIter::MFIter(&local_b0,pFVar8,'\0');
    if (local_b0.currentIndex < local_b0.endIndex) {
      pBVar7 = (BoxArray *)
               ((long)&(local_130->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       boxarray.m_bat.m_bat_type + local_100);
      do {
        BATransformer::operator()
                  (&local_4c,&((local_b0.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_b0.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_b0.currentIndex] * 0x1c +
                          *(long *)&((((local_b0.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        BoxArray::intersections(&local_148,pBVar7,&local_4c);
        if (0 < (int)((ulong)((long)local_148.
                                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_148.
                                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
          lVar11 = 4;
          lVar12 = 0;
          do {
            piVar5 = &local_b0.currentIndex;
            if (local_b0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar5 = ((local_b0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start + local_b0.currentIndex;
            }
            local_128.smallend.vect[0] = 0;
            local_128.smallend.vect[1] = 0;
            BaseFab<double>::setVal<(amrex::RunOn)1>
                      (*(BaseFab<double> **)
                        (*(long *)((long)&pFVar4[3].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                                          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar10) +
                        (long)*piVar5 * 8),(double *)&local_128,
                       (Box *)((long)((local_148.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                                     vect + lVar11 + -4),(DestComp)0x0,ncomp);
            lVar12 = lVar12 + 1;
            lVar11 = lVar11 + 0x20;
          } while (lVar12 < (int)((ulong)((long)local_148.
                                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_148.
                                               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 5));
        }
        if ((*(char *)((long)(geom->super_CoordSys).inv_dx + lVar9 + 0x19) != '\0') &&
           (uVar2 = (geom->domain).bigend.vect[lVar9], local_4c.bigend.vect[lVar9] == uVar2)) {
          iVar6 = ~uVar2 + (geom->domain).smallend.vect[lVar9];
          local_128.bigend.vect[2] = local_4c.bigend.vect[2];
          local_128.btype.itype = local_4c.btype.itype;
          local_128.smallend.vect[0] = local_4c.smallend.vect[0];
          local_128.smallend.vect[1] = local_4c.smallend.vect[1];
          piVar5 = local_128.smallend.vect + lVar9;
          *piVar5 = *piVar5 + iVar6;
          piVar5 = local_128.bigend.vect + lVar9;
          *piVar5 = *piVar5 + iVar6;
          BoxArray::intersections(&local_f0,pBVar7,&local_128);
          if (0 < (int)((ulong)((long)local_f0.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_f0.
                                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
            lVar12 = 4;
            lVar11 = 0;
            do {
              iVar6 = ((geom->domain).bigend.vect[lVar9] - (geom->domain).smallend.vect[lVar9]) + 1;
              piVar5 = (int *)((long)((local_f0.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                                     vect + lVar12 + -4);
              uVar3 = *(undefined8 *)(piVar5 + 2);
              puVar1 = (undefined8 *)
                       ((long)((local_f0.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->second).smallend.vect +
                       lVar12 + 8);
              local_d8.bigend.vect[1] = (int)((ulong)*puVar1 >> 0x20);
              local_d8._20_8_ = puVar1[1];
              local_d8.smallend.vect._0_8_ = *(undefined8 *)piVar5;
              local_d8.smallend.vect[2] = (int)uVar3;
              local_d8.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
              piVar5 = local_d8.smallend.vect + lVar9;
              *piVar5 = *piVar5 + iVar6;
              piVar5 = local_d8.bigend.vect + lVar9;
              *piVar5 = *piVar5 + iVar6;
              piVar5 = &local_b0.currentIndex;
              if (local_b0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar5 = ((local_b0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + local_b0.currentIndex;
              }
              local_f8 = 0.0;
              BaseFab<double>::setVal<(amrex::RunOn)1>
                        (*(BaseFab<double> **)
                          (*(long *)((long)&pFVar4[3].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v
                                            .
                                            super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar10) +
                          (long)*piVar5 * 8),&local_f8,&local_d8,(DestComp)0x0,ncomp);
              lVar11 = lVar11 + 1;
              lVar12 = lVar12 + 0x20;
            } while (lVar11 < (int)((ulong)((long)local_f0.
                                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_f0.
                                                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 5));
          }
          if (local_f0.
              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f0.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_f0.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f0.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_148.
            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_148.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_148.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_148.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        MFIter::operator++(&local_b0);
      } while (local_b0.currentIndex < local_b0.endIndex);
    }
    MFIter::~MFIter(&local_b0);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  return;
}

Assistant:

void
FluxRegister::ClearInternalBorders (const Geometry& geom)
{
    int nc = this->nComp();
    const Box& domain = geom.Domain();

    Vector<Array4BoxTag<Real> > tags;

    for (int dir = 0; dir < AMREX_SPACEDIM; dir++) {
        Orientation lo(dir, Orientation::low);
        Orientation hi(dir, Orientation::high);

        FabSet& frlo = (*this)[lo];
        FabSet& frhi = (*this)[hi];

        const BoxArray& balo = frlo.boxArray();
        const BoxArray& bahi = frhi.boxArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        {
            for (FabSetIter fsi(frlo); fsi.isValid(); ++fsi) {
                const Box& bx = fsi.validbox();
                const std::vector< std::pair<int,Box> >& isects = bahi.intersections(bx);
                auto const& frarr = frlo[fsi].array();
                for (int ii = 0; ii < static_cast<int>(isects.size()); ++ii) {
                    if (Gpu::inLaunchRegion()) {
                        tags.emplace_back(Array4BoxTag<Real>{frarr, isects[ii].second});
                    } else {
                        frlo[fsi].setVal<RunOn::Host>(0.0, isects[ii].second, 0, nc);
                    }
                }
                if (geom.isPeriodic(dir)) {
                    if (bx.smallEnd(dir) == domain.smallEnd(dir)) {
                        const Box& sbx = amrex::shift(bx, dir, domain.length(dir));
                        const std::vector<std::pair<int,Box> >& isects2 = bahi.intersections(sbx);
                        for (int ii = 0; ii < static_cast<int>(isects2.size()); ++ii) {
                            const Box& bx2 = amrex::shift(isects2[ii].second, dir, -domain.length(dir));
                            if (Gpu::inLaunchRegion()) {
                                tags.emplace_back(Array4BoxTag<Real>{frarr, bx2});
                            } else {
                                frlo[fsi].setVal<RunOn::Host>(0.0, bx2, 0, nc);
                            }
                        }
                    }
                }
            }

            for (FabSetIter fsi(frhi); fsi.isValid(); ++fsi) {
                const Box& bx = fsi.validbox();
                const std::vector< std::pair<int,Box> >& isects = balo.intersections(bx);
                auto const& frarr = frhi[fsi].array();
                for (int ii = 0; ii < static_cast<int>(isects.size()); ++ii) {
                    if (Gpu::inLaunchRegion()) {
                        tags.emplace_back(Array4BoxTag<Real>{frarr, isects[ii].second});
                    } else {
                        frhi[fsi].setVal<RunOn::Host>(0.0, isects[ii].second, 0, nc);
                    }
                }
                if (geom.isPeriodic(dir)) {
                    if (bx.bigEnd(dir) == domain.bigEnd(dir)) {
                        const Box& sbx = amrex::shift(bx, dir, -domain.length(dir));
                        const std::vector<std::pair<int,Box> >& isects2 = balo.intersections(sbx);
                        for (int ii = 0; ii < static_cast<int>(isects2.size()); ++ii) {
                            const Box& bx2 = amrex::shift(isects2[ii].second, dir, domain.length(dir));
                            if (Gpu::inLaunchRegion()) {
                                tags.emplace_back(Array4BoxTag<Real>{frarr, bx2});
                            } else {
                                frhi[fsi].setVal<RunOn::Host>(0.0, bx2, 0, nc);
                            }
                        }
                    }
                }
            }
        }
    }

#ifdef AMREX_USE_GPU
    // There is Gpu::streamSynchronize in Parallelfor below internally.
    ParallelFor(tags, nc,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n, Array4BoxTag<Real> const& tag)
    {
        tag.dfab(i,j,k,n) = 0.0;
    });
#endif
}